

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O0

void __thiscall
psy::TextElementTable<psy::C::ImaginaryFloatingConstant>::rehash
          (TextElementTable<psy::C::ImaginaryFloatingConstant> *this)

{
  int iVar1;
  TextElement *this_00;
  uint uVar2;
  ImaginaryFloatingConstant **ppIVar3;
  uint h;
  ImaginaryFloatingConstant *cur;
  ImaginaryFloatingConstant **it;
  ImaginaryFloatingConstant **last;
  TextElementTable<psy::C::ImaginaryFloatingConstant> *this_local;
  
  if (this->buckets_ != (ImaginaryFloatingConstant **)0x0) {
    free(this->buckets_);
  }
  if (this->bucketCount_ == 0) {
    this->bucketCount_ = 4;
  }
  else {
    this->bucketCount_ = this->bucketCount_ << 1;
  }
  ppIVar3 = (ImaginaryFloatingConstant **)calloc((long)this->bucketCount_,8);
  this->buckets_ = ppIVar3;
  ppIVar3 = this->elements_;
  iVar1 = this->count_;
  for (cur = (ImaginaryFloatingConstant *)this->elements_;
      cur != (ImaginaryFloatingConstant *)(ppIVar3 + (iVar1 + 1));
      cur = (ImaginaryFloatingConstant *)&(cur->super_Lexeme).field_0x8) {
    this_00 = *(TextElement **)&cur->super_Lexeme;
    uVar2 = TextElement::hashCode(this_00);
    uVar2 = uVar2 % (uint)this->bucketCount_;
    *(ImaginaryFloatingConstant **)(this_00 + 0x20) = this->buckets_[uVar2];
    this->buckets_[uVar2] = (ImaginaryFloatingConstant *)this_00;
  }
  return;
}

Assistant:

void rehash()
    {
       if (buckets_)
           std::free(buckets_);

       if (!bucketCount_)
           bucketCount_ = 4;
       else
           bucketCount_ <<= 1;

       buckets_ = (ElemT**)std::calloc(bucketCount_, sizeof(ElemT*));

       ElemT** last = elements_ + (count_ + 1);
       for (ElemT** it = elements_; it != last; ++it) {
           ElemT* cur = *it;
           unsigned int h = cur->hashCode() % bucketCount_;
           cur->next_ = buckets_[h];
           buckets_[h] = cur;
       }
    }